

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
FMultiBlockThingsIterator::FMultiBlockThingsIterator
          (FMultiBlockThingsIterator *this,FPortalGroupArray *check,double checkx,double checky,
          double checkz,double checkh,double checkradius,bool ignorerestricted,sector_t *newsec)

{
  sector_t_conflict *local_50;
  sector_t *newsec_local;
  bool ignorerestricted_local;
  double checkradius_local;
  double checkh_local;
  double checkz_local;
  double checky_local;
  double checkx_local;
  FPortalGroupArray *check_local;
  FMultiBlockThingsIterator *this_local;
  
  this->checklist = check;
  TVector3<double>::TVector3(&this->checkpoint);
  FBlockThingsIterator::FBlockThingsIterator(&this->blockIterator);
  FBoundingBox::FBoundingBox(&this->bbox);
  (this->checkpoint).X = checkx;
  (this->checkpoint).Y = checky;
  (this->checkpoint).Z = checkz;
  local_50 = (sector_t_conflict *)newsec;
  if (newsec == (sector_t *)0x0) {
    local_50 = P_PointInSector(checkx,checky);
  }
  this->basegroup = (short)local_50->PortalGroup;
  if ((check->inited & 1U) == 0) {
    P_CollectConnectedGroups
              ((int)this->basegroup,&this->checkpoint,checkz + checkh,checkradius,this->checklist);
  }
  (this->checkpoint).Z = checkradius;
  Reset(this);
  return;
}

Assistant:

FMultiBlockThingsIterator::FMultiBlockThingsIterator(FPortalGroupArray &check, double checkx, double checky, double checkz, double checkh, double checkradius, bool ignorerestricted, sector_t *newsec)
	: checklist(check)
{
	checkpoint.X = checkx;
	checkpoint.Y = checky;
	checkpoint.Z = checkz;
	if (newsec == NULL) newsec = P_PointInSector(checkx, checky);
	basegroup = newsec->PortalGroup;
	if (!check.inited) P_CollectConnectedGroups(basegroup, checkpoint, checkz + checkh, checkradius, checklist);
	checkpoint.Z = checkradius;
	Reset();
}